

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

BrotliDecoderResult SaveErrorCode(BrotliDecoderStateInternal *s,BrotliDecoderErrorCode e)

{
  BrotliDecoderResult BVar1;
  
  s->error_code = e;
  BVar1 = BROTLI_DECODER_RESULT_ERROR;
  if ((uint)(e + BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_NIBBLE) < 3) {
    BVar1 = e;
  }
  return BVar1;
}

Assistant:

static BROTLI_NOINLINE BrotliDecoderResult SaveErrorCode(
    BrotliDecoderState* s, BrotliDecoderErrorCode e) {
  s->error_code = (int)e;
  switch (e) {
    case BROTLI_DECODER_SUCCESS:
      return BROTLI_DECODER_RESULT_SUCCESS;

    case BROTLI_DECODER_NEEDS_MORE_INPUT:
      return BROTLI_DECODER_RESULT_NEEDS_MORE_INPUT;

    case BROTLI_DECODER_NEEDS_MORE_OUTPUT:
      return BROTLI_DECODER_RESULT_NEEDS_MORE_OUTPUT;

    default:

      return BROTLI_DECODER_RESULT_ERROR;
  }
}